

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtableview.cpp
# Opt level: O2

void __thiscall
QTableView::selectionChanged(QTableView *this,QItemSelection *selected,QItemSelection *deselected)

{
  QTableViewPrivate *this_00;
  char cVar1;
  int iVar2;
  long in_FS_OFFSET;
  QArrayDataPointer<QModelIndex> local_b0;
  Data *local_98;
  QModelIndex *pQStack_90;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_88;
  QModelIndex local_78;
  code *local_58;
  quintptr qStack_50;
  totally_ordered_wrapper<const_QAbstractItemModel_*> tStack_48;
  int local_40;
  undefined4 uStack_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QTableViewPrivate **)
             &(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget.
              field_0x8;
  cVar1 = QAccessible::isActive();
  if (cVar1 != '\0') {
    QItemSelection::indexes();
    local_58 = (code *)0xffffffffffffffff;
    qStack_50 = 0;
    tStack_48.ptr = (QAbstractItemModel *)0x0;
    if (local_88.ptr == (QAbstractItemModel *)0x0) {
      pQStack_90 = (QModelIndex *)&local_58;
    }
    local_78._0_8_ = *(undefined8 *)pQStack_90;
    local_78.i = pQStack_90->i;
    local_78.m.ptr = (pQStack_90->m).ptr;
    QArrayDataPointer<QModelIndex>::~QArrayDataPointer((QArrayDataPointer<QModelIndex> *)&local_98);
    if (((-1 < local_78.r) && (-1 < (long)local_78._0_8_)) &&
       (local_78.m.ptr != (QAbstractItemModel *)0x0)) {
      iVar2 = QTableViewPrivate::accessibleTable2Index(this_00,&local_78);
      local_58 = QFont::strikeOut;
      qStack_50 = 0xaaaaaaaa00008007;
      _local_40 = CONCAT44(0xaaaaaaaa,iVar2);
      tStack_48.ptr = (QAbstractItemModel *)this;
      QAccessible::updateAccessibility((QAccessibleEvent *)&local_58);
      QAccessibleEvent::~QAccessibleEvent((QAccessibleEvent *)&local_58);
    }
    QItemSelection::indexes();
    local_58 = (code *)0xffffffffffffffff;
    qStack_50 = 0;
    tStack_48.ptr = (QAbstractItemModel *)0x0;
    if (local_b0.size == 0) {
      local_b0.ptr = (QModelIndex *)&local_58;
    }
    local_98 = *(Data **)local_b0.ptr;
    pQStack_90 = (QModelIndex *)(local_b0.ptr)->i;
    local_88.ptr = ((local_b0.ptr)->m).ptr;
    QArrayDataPointer<QModelIndex>::~QArrayDataPointer(&local_b0);
    if (((-1 < (int)local_98) && (-1 < (long)local_98)) &&
       (local_88.ptr != (QAbstractItemModel *)0x0)) {
      iVar2 = QTableViewPrivate::accessibleTable2Index(this_00,(QModelIndex *)&local_98);
      local_58 = QFont::strikeOut;
      qStack_50 = 0xaaaaaaaa00008008;
      _local_40 = CONCAT44(0xaaaaaaaa,iVar2);
      tStack_48.ptr = (QAbstractItemModel *)this;
      QAccessible::updateAccessibility((QAccessibleEvent *)&local_58);
      QAccessibleEvent::~QAccessibleEvent((QAccessibleEvent *)&local_58);
    }
  }
  QAbstractItemView::selectionChanged((QAbstractItemView *)this,selected,deselected);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTableView::selectionChanged(const QItemSelection &selected,
                                  const QItemSelection &deselected)
{
    Q_D(QTableView);
    Q_UNUSED(d);
#if QT_CONFIG(accessibility)
    if (QAccessible::isActive()) {
        // ### does not work properly for selection ranges.
        QModelIndex sel = selected.indexes().value(0);
        if (sel.isValid()) {
            int entry = d->accessibleTable2Index(sel);
            QAccessibleEvent event(this, QAccessible::SelectionAdd);
            event.setChild(entry);
            QAccessible::updateAccessibility(&event);
        }
        QModelIndex desel = deselected.indexes().value(0);
        if (desel.isValid()) {
            int entry = d->accessibleTable2Index(desel);
            QAccessibleEvent event(this, QAccessible::SelectionRemove);
            event.setChild(entry);
            QAccessible::updateAccessibility(&event);
        }
    }
#endif
    QAbstractItemView::selectionChanged(selected, deselected);
}